

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::nameinfo::getdata(nameinfo *this,uint8_t *p,ImgfsFile *imgfs)

{
  string *buf;
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  uint size;
  Wstring wstr;
  Wstring wstr_1;
  string local_50;
  
  uVar1 = this->_length;
  iVar7 = 0;
  if (uVar1 >= 5) {
    iVar7 = 2 - (uint)(uVar1 < 0x19);
  }
  uVar2 = (this->_name)._M_string_length;
  bVar3 = uVar1 < 5;
  if (4 < uVar2) {
    bVar3 = 2 - (uint)(uVar2 < 0x19) == iVar7;
  }
  uVar8 = uVar2;
  if (!bVar3) {
    if (iVar7 == 2) {
      freechunk(imgfs,(ulong)this->_ptr,((imgfs->_hdr).bytesperchunk - 1 | (uint)uVar1 * 2 - 1) + 1)
      ;
    }
    else if (iVar7 == 1) {
      freeent(imgfs,(ulong)this->_ptr);
    }
    this->_ptr = 0;
    uVar8 = (this->_name)._M_string_length;
  }
  if (uVar8 < 0x10000) {
    buf = &this->_name;
    this->_length = (uint16_t)uVar8;
    *(uint16_t *)p = (uint16_t)uVar8;
    if (uVar2 < 5) {
      *(uint16_t *)(p + 2) = this->_flags;
      ToWString<char>(&wstr,buf);
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 2) {
        (p + lVar5 + 4)[0] = '\0';
        (p + lVar5 + 4)[1] = '\0';
      }
      if (wstr._M_string_length != 0) {
        memmove(p + 4,wstr._M_dataplus._M_p,wstr._M_string_length * 2);
      }
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~basic_string(&wstr);
    }
    else {
      if (this->_ptr == 0) {
        ToWString<char>(&wstr_1,buf);
        if (uVar2 < 0x19) {
          *(byte *)&this->_flags = (byte)this->_flags | 2;
          NameEntry::NameEntry((NameEntry *)&wstr,buf);
          DirEntry::save((DirEntry *)&wstr,imgfs);
          uVar4 = DirEntry::offset((DirEntry *)&wstr);
          this->_ptr = uVar4;
          NameEntry::~NameEntry((NameEntry *)&wstr);
        }
        else {
          size = ((imgfs->_hdr).bytesperchunk - 1 | (int)wstr_1._M_string_length * 2 - 1U) + 1;
          uVar4 = allocchunk(imgfs,size,NAMECHUNK);
          this->_ptr = uVar4;
          std::__cxx11::
          basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          ::resize(&wstr_1,(ulong)(size >> 1));
          std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&wstr,
                     &(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
          (**(code **)(*(long *)wstr._M_dataplus._M_p + 0x20))(wstr._M_dataplus._M_p,this->_ptr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wstr._M_string_length);
          std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&wstr,
                     &(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
          (**(code **)(*(long *)wstr._M_dataplus._M_p + 0x18))
                    (wstr._M_dataplus._M_p,wstr_1._M_dataplus._M_p,size);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wstr._M_string_length);
        }
        std::__cxx11::
        basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
        ::~basic_string(&wstr_1);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)buf);
      uVar4 = calc_name_hash(&local_50);
      this->_hash = uVar4;
      std::__cxx11::string::~string((string *)&local_50);
      *(uint16_t *)(p + 2) = this->_flags;
      *(uint32_t *)(p + 4) = this->_hash;
      *(uint32_t *)(p + 8) = this->_ptr;
    }
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "filename too long";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void getdata(uint8_t *p, ImgfsFile& imgfs)
        {
            int oldtype= nametype(_length);
            int newtype= nametype(_name.size());

            // first free resources
            if (oldtype!=newtype) {
                if (oldtype==IN_NAME_ENTRY)
                    imgfs.freeent(_ptr);
                else if (oldtype==IN_NAME_CHUNK)
                    imgfs.freechunk(_ptr, imgfs.roundtochunk(_length*sizeof(WCHAR)));
                _ptr= 0;
            }
            if (_name.size()>=0x10000)
                throw "filename too long";
            _length= (uint16_t)_name.size();
            set16le(p, _length);
            if (newtype==IN_DIR_ENTRY) {
                set16le(p+2, _flags);
                std::Wstring wstr= ToWString(_name);
                std::fill_n((WCHAR*)(p+4), 4, WCHAR(0));
                // note: nonportable endian cast
                std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
            }
            else {
                if (_ptr==0) {
                    std::Wstring wstr= ToWString(_name);
                    if (newtype==IN_NAME_ENTRY)
                    {
                        _flags|= 2;
                        NameEntry ent(_name);
                        ent.save(imgfs);
                        _ptr= ent.offset();
                    }
                    else {
                        size_t rounded= imgfs.roundtochunk(wstr.size()*sizeof(WCHAR));
                        // alloc chunk
                        _ptr= imgfs.allocchunk(rounded, NAMECHUNK);

                        wstr.resize(rounded/sizeof(WCHAR));
                        imgfs.rd()->setpos(_ptr);
                        //printf("nameinfo: getdata(%08x)\n", _ptr);
                        imgfs.rd()->write((const uint8_t*)wstr.c_str(), rounded);
                    }
                }
                _hash= calc_name_hash(_name);
                set16le(p+2, _flags);
                set32le(p+4, _hash);
                set32le(p+8, _ptr);
            }
        }